

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nqueens.c
# Opt level: O3

void run_WRAP(WorkerP *w,Task *__dq_head,TD_run *t)

{
  long lVar1;
  FILE *pFVar2;
  ulong uVar3;
  undefined8 uVar4;
  MTBDD MVar5;
  size_t sVar6;
  ulong uVar7;
  MTBDD *pMVar8;
  char *pcVar9;
  MTBDD *pMVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  ulong auStack_c0 [2];
  MTBDD *pMStack_b0;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_a8;
  _Worker *p_Stack_a0;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_98;
  MTBDD *pMStack_90;
  undefined1 auStack_88 [24];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_70;
  char acStack_68 [32];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_48;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_40;
  MTBDD *pMStack_38;
  
  auStack_c0[0] = 0x10356e;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  uVar4 = auStack_88._8_8_;
  p_Stack_a8 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._0_8_;
  lVar1 = -(size * size * 8 + 0xf & 0xfffffffffffffff0);
  pMVar8 = (MTBDD *)((long)auStack_c0 + lVar1 + 8);
  if (size != 0) {
    uVar7 = 0;
    pMVar10 = pMVar8;
    do {
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035b0;
      MVar5 = mtbdd_ithvar((uint32_t)uVar7);
      *pMVar10 = MVar5;
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035bb;
      mtbdd_protect(pMVar10);
      uVar7 = uVar7 + 1;
      pMVar10 = pMVar10 + 1;
    } while (uVar7 < size * size);
  }
  p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035ef;
  mtbdd_protect((MTBDD *)&p_Stack_40);
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1035f7;
  mtbdd_protect((MTBDD *)&p_Stack_48);
  p_Stack_98 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103606;
  mtbdd_protect((MTBDD *)&p_Stack_98);
  if (size != 0) {
    uVar7 = 0;
    do {
      p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)pMVar8[uVar7];
      auStack_88._0_8_ = sylvan_and_WRAP;
      auStack_88._8_8_ = (_Worker *)0x1;
      acStack_68[0] = '\0';
      acStack_68[1] = '\0';
      acStack_68[2] = '\0';
      acStack_68[3] = '\0';
      auStack_88._16_8_ = p_Stack_98;
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10364c;
      lace_run_task((Task *)auStack_88);
      p_Stack_98 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
      uVar7 = uVar7 + 1;
    } while (uVar7 < size * size);
  }
  pFVar2 = _stdout;
  pMStack_90 = pMVar8;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103689;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  dVar15 = (double)(long)auStack_88._0_8_;
  dVar14 = (double)(long)auStack_88._8_8_;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1036b9;
  fprintf(pFVar2,"[% 8.2f] Initialisation complete!\n",(dVar14 * 1e-06 + dVar15) - t_start);
  pFVar2 = _stdout;
  p_Stack_a0 = (_Worker *)uVar4;
  if (report_minor == '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103703;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding rows...\n";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1036d6;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding rows... ";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103739;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    lVar13 = 0;
    pMStack_38 = (MTBDD *)0x0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10376f;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10377e;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar7 = 0;
      do {
        auStack_88._16_8_ = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        uVar11 = 0;
        sVar6 = size;
        do {
          if (uVar7 != uVar11) {
            p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                         (*(ulong *)((long)pMStack_90 + uVar11 * 8 + sVar6 * lVar13) ^
                         0x8000000000000000);
            auStack_88._0_8_ = sylvan_and_WRAP;
            auStack_88._8_8_ = (_Worker *)0x1;
            acStack_68[0] = '\0';
            acStack_68[1] = '\0';
            acStack_68[2] = '\0';
            acStack_68[3] = '\0';
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1037e9;
            lace_run_task((Task *)auStack_88);
            p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
            sVar6 = size;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < sVar6);
        auStack_88._16_8_ = auStack_88._16_8_ ^ 0x8000000000000000;
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     pMStack_90[sVar6 * (long)pMStack_38 + uVar7];
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103847;
        lace_run_task((Task *)auStack_88);
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     (auStack_88._16_8_ ^ 0x8000000000000000);
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        auStack_88._16_8_ = p_Stack_40;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        p_Stack_48 = p_Stack_70;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10387d;
        lace_run_task((Task *)auStack_88);
        p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
        uVar7 = uVar7 + 1;
      } while (uVar7 < size);
      pMStack_38 = (MTBDD *)((long)pMStack_38 + 1);
      lVar13 = lVar13 + 8;
    } while (pMStack_38 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1038c3;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1038e8;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_40;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103947;
    lace_run_task((Task *)auStack_88);
    pMVar8 = pMStack_38;
    uVar4 = auStack_88._16_8_;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103963;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar8,uVar4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103984;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding columns... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1039b8;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding columns...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1039ee;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    pMVar8 = (MTBDD *)0x0;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103a1a;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103a29;
        fflush(_stdout);
        if (size == 0) break;
      }
      pMVar10 = pMStack_90;
      uVar7 = 0;
      pMStack_38 = pMVar8;
      do {
        auStack_88._16_8_ = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        uVar11 = 0;
        sVar6 = size;
        do {
          if (uVar7 != uVar11) {
            p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                         (pMVar10[(long)((long)pMVar8 + sVar6 * uVar11)] ^ 0x8000000000000000);
            auStack_88._0_8_ = sylvan_and_WRAP;
            auStack_88._8_8_ = (_Worker *)0x1;
            acStack_68[0] = '\0';
            acStack_68[1] = '\0';
            acStack_68[2] = '\0';
            acStack_68[3] = '\0';
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103a9b;
            lace_run_task((Task *)auStack_88);
            p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
            sVar6 = size;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < sVar6);
        auStack_88._16_8_ = auStack_88._16_8_ ^ 0x8000000000000000;
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     pMVar10[(long)((long)pMVar8 + sVar6 * uVar7)];
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103aeb;
        lace_run_task((Task *)auStack_88);
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     (auStack_88._16_8_ ^ 0x8000000000000000);
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        auStack_88._16_8_ = p_Stack_40;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        p_Stack_48 = p_Stack_70;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103b20;
        lace_run_task((Task *)auStack_88);
        p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
        uVar7 = uVar7 + 1;
      } while (uVar7 < size);
      pMVar8 = (MTBDD *)((long)pMStack_38 + 1);
    } while (pMVar8 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103b5e;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103b83;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_40;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103be2;
    lace_run_task((Task *)auStack_88);
    pMVar8 = pMStack_38;
    uVar4 = auStack_88._16_8_;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103bfe;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar8,uVar4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103c1f;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding rising diagonals... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103c53;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding rising diagonals...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103c89;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar7 = 0;
    pMVar8 = pMStack_90;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103cbd;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103ccc;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar11 = 0;
      pMStack_38 = pMVar8;
      do {
        auStack_88._16_8_ = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        lVar13 = 0;
        uVar12 = 0;
        sVar6 = size;
        do {
          if (((uVar7 != uVar12) && (uVar7 <= uVar12 + uVar11)) && (uVar12 + uVar11 < sVar6 + uVar7)
             ) {
            p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                         (*(ulong *)((long)pMVar8 + uVar12 * 8 + sVar6 * lVar13) ^
                         0x8000000000000000);
            auStack_88._0_8_ = sylvan_and_WRAP;
            auStack_88._8_8_ = (_Worker *)0x1;
            acStack_68[0] = '\0';
            acStack_68[1] = '\0';
            acStack_68[2] = '\0';
            acStack_68[3] = '\0';
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103d49;
            lace_run_task((Task *)auStack_88);
            p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
            sVar6 = size;
          }
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 8;
        } while (uVar12 < sVar6);
        auStack_88._16_8_ = auStack_88._16_8_ ^ 0x8000000000000000;
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     pMStack_90[sVar6 * uVar7 + uVar11];
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103db3;
        lace_run_task((Task *)auStack_88);
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     (auStack_88._16_8_ ^ 0x8000000000000000);
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        auStack_88._16_8_ = p_Stack_40;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        p_Stack_48 = p_Stack_70;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103dea;
        lace_run_task((Task *)auStack_88);
        p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
        uVar11 = uVar11 + 1;
        pMVar8 = pMVar8 + 1;
      } while (uVar11 < size);
      uVar7 = uVar7 + 1;
      pMVar8 = pMStack_38 + -1;
    } while (uVar7 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103e33;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103e58;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_40;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103eb7;
    lace_run_task((Task *)auStack_88);
    pMVar8 = pMStack_38;
    uVar4 = auStack_88._16_8_;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103ed3;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar8,uVar4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103ef4;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding falling diagonals... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103f28;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Encoding falling diagonals...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103f5e;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  if (size != 0) {
    uVar7 = 0;
    pMVar8 = pMStack_90;
    do {
      if (report_minor == '\x01') {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103f92;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x103fa1;
        fflush(_stdout);
        if (size == 0) break;
      }
      uVar11 = 0;
      pMStack_b0 = pMVar8;
      do {
        auStack_88._16_8_ = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x8000000000000000;
        lVar13 = 0;
        uVar12 = 0;
        sVar6 = size;
        auStack_c0[1] = uVar11;
        pMStack_38 = pMVar8;
        do {
          if (((uVar7 != uVar12) && (uVar12 <= uVar11 + uVar7)) && (uVar11 + uVar7 < sVar6 + uVar12)
             ) {
            p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                         (*(ulong *)((long)pMVar8 + sVar6 * lVar13) ^ 0x8000000000000000);
            auStack_88._0_8_ = sylvan_and_WRAP;
            auStack_88._8_8_ = (_Worker *)0x1;
            acStack_68[0] = '\0';
            acStack_68[1] = '\0';
            acStack_68[2] = '\0';
            acStack_68[3] = '\0';
            *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10402a;
            lace_run_task((Task *)auStack_88);
            p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
            sVar6 = size;
          }
          uVar3 = auStack_c0[1];
          uVar12 = uVar12 + 1;
          pMVar8 = pMVar8 + -1;
          lVar13 = lVar13 + 8;
        } while (uVar12 < sVar6);
        auStack_88._16_8_ = auStack_88._16_8_ ^ 0x8000000000000000;
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     pMStack_90[sVar6 * uVar7 + auStack_c0[1]];
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10409f;
        lace_run_task((Task *)auStack_88);
        p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                     (auStack_88._16_8_ ^ 0x8000000000000000);
        auStack_88._0_8_ = sylvan_and_WRAP;
        auStack_88._8_8_ = (_Worker *)0x1;
        auStack_88._16_8_ = p_Stack_40;
        acStack_68[0] = '\0';
        acStack_68[1] = '\0';
        acStack_68[2] = '\0';
        acStack_68[3] = '\0';
        p_Stack_48 = p_Stack_70;
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1040cf;
        lace_run_task((Task *)auStack_88);
        p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
        uVar11 = uVar3 + 1;
        pMVar8 = pMStack_38 + 1;
      } while (uVar11 < size);
      uVar7 = uVar7 + 1;
      pMVar8 = pMStack_b0 + 1;
    } while (uVar7 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104122;
    putchar(10);
  }
  pFVar2 = _stdout;
  if (report_minterms == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104147;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_)
                          - t_start);
    auStack_88._0_8_ = sylvan_satcount_WRAP;
    auStack_88._8_8_ = (_Worker *)0x1;
    auStack_88._16_8_ = p_Stack_40;
    p_Stack_70 = p_Stack_98;
    acStack_68[0] = '\0';
    acStack_68[1] = '\0';
    acStack_68[2] = '\0';
    acStack_68[3] = '\0';
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1041a6;
    lace_run_task((Task *)auStack_88);
    pMVar8 = pMStack_38;
    uVar4 = auStack_88._16_8_;
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1041c2;
    fprintf(pFVar2,"[% 8.2f] We have %.0f minterms\n",pMVar8,uVar4);
  }
  pFVar2 = _stdout;
  if (report_minor == '\x01') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1041e3;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Final computation to place a queen on every row... ";
  }
  else {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104217;
    gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
    dVar14 = (double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_;
    pcVar9 = "[% 8.2f] Final computation to place a queen on every row...\n";
  }
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10424d;
  fprintf(pFVar2,pcVar9,dVar14 - t_start);
  pMVar8 = pMStack_90;
  if (size != 0) {
    lVar13 = 0;
    pMVar10 = (MTBDD *)0x0;
    do {
      pMStack_38 = pMVar10;
      if (report_minor == '\0') {
LAB_001042ce:
        p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x0;
        auStack_88._16_8_ = 0x8000000000000000;
        uVar7 = 0;
        do {
          p_Stack_70 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (*(ulong *)((long)pMVar8 + uVar7 * 8 + size * lVar13) ^ 0x8000000000000000);
          auStack_88._0_8_ = sylvan_and_WRAP;
          auStack_88._8_8_ = (_Worker *)0x1;
          acStack_68[0] = '\0';
          acStack_68[1] = '\0';
          acStack_68[2] = '\0';
          acStack_68[3] = '\0';
          *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104304;
          lace_run_task((Task *)auStack_88);
          p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)
                       (auStack_88._16_8_ ^ 0x8000000000000000);
          uVar7 = uVar7 + 1;
        } while (uVar7 < size);
      }
      else {
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10428b;
        printf("%zu... ");
        *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10429a;
        fflush(_stdout);
        p_Stack_48 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)0x0;
        if (size != 0) goto LAB_001042ce;
      }
      auStack_88._0_8_ = sylvan_and_WRAP;
      auStack_88._8_8_ = (_Worker *)0x1;
      auStack_88._16_8_ = p_Stack_40;
      acStack_68[0] = '\0';
      acStack_68[1] = '\0';
      acStack_68[2] = '\0';
      acStack_68[3] = '\0';
      p_Stack_70 = p_Stack_48;
      *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104352;
      lace_run_task((Task *)auStack_88);
      p_Stack_40 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_88._16_8_;
      pMVar10 = (MTBDD *)((long)pMStack_38 + 1);
      lVar13 = lVar13 + 8;
    } while (pMVar10 < size);
  }
  if (report_minor != '\0') {
    *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104388;
    putchar(10);
  }
  pMStack_90 = (MTBDD *)((double)(long)p_Stack_a0 * 1e-06 + (double)(long)p_Stack_a8);
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1043c2;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  pFVar2 = _stdout;
  pMStack_90 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_) -
                        (double)pMStack_90);
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104408;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  sVar6 = size;
  pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_) -
                        t_start);
  auStack_88._0_8_ = sylvan_satcount_WRAP;
  auStack_88._8_8_ = (_Worker *)0x1;
  auStack_88._16_8_ = p_Stack_40;
  p_Stack_70 = p_Stack_98;
  acStack_68[0] = '\0';
  acStack_68[1] = '\0';
  acStack_68[2] = '\0';
  acStack_68[3] = '\0';
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10446e;
  lace_run_task((Task *)auStack_88);
  pMVar8 = pMStack_38;
  uVar4 = auStack_88._16_8_;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10448d;
  fprintf(pFVar2,"[% 8.2f] Result: NQueens(%zu) has %.0f solutions.\n",pMVar8,uVar4,sVar6);
  pFVar2 = _stdout;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10449b;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  pMStack_38 = (MTBDD *)(((double)(long)auStack_88._8_8_ * 1e-06 + (double)(long)auStack_88._0_8_) -
                        t_start);
  auStack_88._0_8_ = p_Stack_40;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1044da;
  sVar6 = mtbdd_nodecount_more((MTBDD *)auStack_88,1);
  pMVar8 = pMStack_38;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x1044f3;
  fprintf(pFVar2,"[% 8.2f] Result BDD has %zu nodes.\n",pMVar8,sVar6);
  pFVar2 = _stdout;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x104501;
  gettimeofday((timeval *)auStack_88,(__timezone_ptr_t)0x0);
  pMVar8 = pMStack_90;
  dVar15 = (double)(long)auStack_88._0_8_;
  dVar14 = (double)(long)auStack_88._8_8_;
  *(undefined8 *)((long)auStack_c0 + lVar1) = 0x10453f;
  fprintf(pFVar2,"[% 8.2f] Computation time: %f sec.\n",(dVar14 * 1e-06 + dVar15) - t_start,pMVar8);
  return;
}

Assistant:

VOID_TASK_0(run)
{
    double t1 = wctime();

    BDD zero = sylvan_false;
    BDD one = sylvan_true;

    // Variables 0 ... (SIZE*SIZE-1)

    BDD board[size*size];
    for (size_t i=0; i<size*size; i++) {
        board[i] = sylvan_ithvar(i);
        sylvan_protect(board+i);
    }

    BDD res = one, temp = one;

    // we use sylvan's "protect" marking mechanism...
    // that means we hardly need to do manual ref/deref when the variables change
    sylvan_protect(&res);
    sylvan_protect(&temp);

    // Old satcount function still requires a silly variables cube
    BDD vars = one;
    sylvan_protect(&vars);
    for (size_t i=0; i<size*size; i++) vars = sylvan_and(vars, board[i]);

    INFO("Initialisation complete!\n");

    if (report_minor) {
        INFO("Encoding rows... ");
    } else {
        INFO("Encoding rows...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            // compute "\BigAnd (!board[i][k]) \or !board[i][j]" with k != j
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (j==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[i*size+k]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding columns... ");
    } else {
        INFO("Encoding columns...\n");
    }

    for (size_t j=0; j<size; j++) {
        if (report_minor) {
            printf("%zu... ", j);
            fflush(stdout);
        }

        for (size_t i=0; i<size; i++) {
            // compute "\BigAnd (!board[k][j]) \or !board[i][j]" with k != i
            temp = one;
            for (size_t k=0; k<size; k++) {
                if (i==k) continue;
                temp = sylvan_and(temp, sylvan_not(board[k*size+j]));
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding rising diagonals... ");
    } else {
        INFO("Encoding rising diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+k-i >= 0 && j+k-i < size && k != i)
                if (j+k >= i && j+k < size+i && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+k-i)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size+j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Encoding falling diagonals... ");
    } else {
        INFO("Encoding falling diagonals...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        for (size_t j=0; j<size; j++) {
            temp = one;
            for (size_t k=0; k<size; k++) {
                // if (j+i-k >= 0 && j+i-k < size && k != i)
                if (j+i >= k && j+i < size+k && k != i) {
                    temp = sylvan_and(temp, sylvan_not(board[k*size + (j+i-k)]));
                }
            }
            temp = sylvan_or(temp, sylvan_not(board[i*size + j]));
            // add cube to "res"
            res = sylvan_and(res, temp);
        }
    }

    if (report_minor) {
        printf("\n");
    }
    if (report_minterms) {
        INFO("We have %.0f minterms\n", sylvan_satcount(res, vars));
    }
    if (report_minor) {
        INFO("Final computation to place a queen on every row... ");
    } else {
        INFO("Final computation to place a queen on every row...\n");
    }

    for (size_t i=0; i<size; i++) {
        if (report_minor) {
            printf("%zu... ", i);
            fflush(stdout);
        }

        temp = zero;
        for (size_t j=0; j<size; j++) {
            temp = sylvan_or(temp, board[i*size+j]);
        }
        res = sylvan_and(res, temp);
    }

    if (report_minor) {
        printf("\n");
    }

    double t2 = wctime();

    INFO("Result: NQueens(%zu) has %.0f solutions.\n", size, sylvan_satcount(res, vars));
    INFO("Result BDD has %zu nodes.\n", sylvan_nodecount(res));
    INFO("Computation time: %f sec.\n", t2-t1);
}